

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_vobj.c
# Opt level: O2

void vobj_readconv(GlobalVars *gv,LinkFile *lf)

{
  bool bVar1;
  char *pcVar2;
  
  if (lf->type != '\b') {
    lf->objname = lf->filename;
    vobj_read(gv,lf,lf->data);
    return;
  }
  bVar1 = ar_init(&ai,(char *)lf->data,lf->length,lf->filename);
  if (bVar1 == 0) {
    ierror("vobj_readconv(): archive %s corrupted since last access",lf->pathname);
    return;
  }
  while (bVar1 = ar_extract(&ai), bVar1 != 0) {
    pcVar2 = allocstring(ai.name);
    lf->objname = pcVar2;
    vobj_read(gv,lf,ai.data);
  }
  return;
}

Assistant:

static void vobj_readconv(struct GlobalVars *gv,struct LinkFile *lf)
{
  if (lf->type == ID_LIBARCH) {
    if (ar_init(&ai,(char *)lf->data,lf->length,lf->filename)) {
      while (ar_extract(&ai)) {
        lf->objname = allocstring(ai.name);
        vobj_read(gv,lf,(uint8_t *)ai.data);
      }
    }
    else
      ierror("vobj_readconv(): archive %s corrupted since last access",
             lf->pathname);
  }
  else {
    lf->objname = lf->filename;
    vobj_read(gv,lf,lf->data);
  }
}